

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring_array.h
# Opt level: O3

int32_t ra_get_index(roaring_array_t *ra,uint16_t x)

{
  ushort uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  
  iVar2 = ra->size;
  if (((long)iVar2 != 0) && (ra->keys[(long)iVar2 + -1] != x)) {
    if (iVar2 < 1) {
      return -1;
    }
    iVar2 = iVar2 + -1;
    uVar4 = 0;
    do {
      uVar3 = iVar2 + uVar4 >> 1;
      uVar1 = *(ushort *)((long)ra->keys + (ulong)(iVar2 + uVar4 & 0xfffffffe));
      if (uVar1 < x) {
        uVar4 = uVar3 + 1;
      }
      else {
        if (uVar1 <= x) {
          return uVar3;
        }
        iVar2 = uVar3 - 1;
      }
    } while ((int)uVar4 <= iVar2);
    return ~uVar4;
  }
  return iVar2 + -1;
}

Assistant:

inline int32_t ra_get_index(const roaring_array_t *ra, uint16_t x) {
    if ((ra->size == 0) || ra->keys[ra->size - 1] == x) return ra->size - 1;
    return binarySearch(ra->keys, (int32_t)ra->size, x);
}